

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O3

MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
* __thiscall
vkt::sparse::anon_unknown_0::SparseAllocationBuilder::build
          (MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           *__return_storage_ptr__,SparseAllocationBuilder *this,DeviceInterface *vk,VkDevice device
          ,Allocator *allocator,VkBufferCreateInfo referenceCreateInfo,VkDeviceSize minChunkSize)

{
  deInt32 *pdVar1;
  pointer *ppVVar2;
  long lVar3;
  iterator __position;
  Allocation *pAVar4;
  SparseAllocation *pSVar5;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pUVar6;
  ulong uVar7;
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  *pMVar8;
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  *extraout_RAX;
  uint *puVar9;
  pointer pMVar10;
  ulong uVar11;
  VkMemoryRequirements memoryRequirements;
  SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_> local_b8;
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  *local_a8;
  Allocation *local_a0 [2];
  VkSparseMemoryBind local_90;
  VkBuffer local_68;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_60;
  VkMemoryRequirements local_48;
  
  pSVar5 = (SparseAllocation *)operator_new(0x40);
  *(undefined8 *)pSVar5 = 0;
  pSVar5->resourceSize = 0;
  (pSVar5->allocations).
  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar5->allocations).
  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar5->allocations).
  super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar5->memoryBinds).
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar5->memoryBinds).
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar5->memoryBinds).
  super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ).m_data.ptr = pSVar5;
  referenceCreateInfo.size = 4;
  local_a8 = __return_storage_ptr__;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_90,vk,device,
                     &referenceCreateInfo,(VkAllocationCallbacks *)0x0);
  DStack_60.m_device = (VkDevice)local_90.memory.m_internal;
  DStack_60.m_allocator = (VkAllocationCallbacks *)local_90.memoryOffset;
  local_68.m_internal = local_90.resourceOffset;
  DStack_60.m_deviceIface = (DeviceInterface *)local_90.size;
  ::vk::getBufferMemoryRequirements(&local_48,vk,device,(VkBuffer)local_90.resourceOffset);
  uVar7 = CONCAT44(local_48.alignment._4_4_,(undefined4)local_48.alignment);
  uVar11 = -uVar7 & (minChunkSize + uVar7) - 1;
  if (uVar11 < uVar7) {
    uVar11 = uVar7;
  }
  puVar9 = (this->m_chunksPerAllocation).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar9 != (this->m_chunksPerAllocation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      pSVar5 = (local_a8->
               super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
               ).m_data.ptr;
      local_90.resourceOffset = *puVar9 * uVar11;
      local_90.size = CONCAT44(local_48.alignment._4_4_,(undefined4)local_48.alignment);
      local_90.memory.m_internal._4_4_ = local_48._20_4_;
      local_90.memory.m_internal._0_4_ = local_48.memoryTypeBits;
      (*allocator->_vptr_Allocator[3])(local_a0,allocator,&local_90,0);
      pUVar6 = (UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)operator_new(0x10);
      pAVar4 = local_a0[0];
      local_a0[0] = (Allocation *)0x0;
      (pUVar6->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr =
           pAVar4;
      local_b8.m_state = (SharedPtrStateBase *)0x0;
      local_b8.m_ptr = pUVar6;
      local_b8.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_b8.m_state)->strongRefCount = 0;
      (local_b8.m_state)->weakRefCount = 0;
      (local_b8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d2a198;
      local_b8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar6;
      (local_b8.m_state)->strongRefCount = 1;
      (local_b8.m_state)->weakRefCount = 1;
      std::
      vector<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>>>
      ::
      emplace_back<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>>
                ((vector<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,de::DefaultDeleter<vk::Allocation>>>>>
                  *)&pSVar5->allocations,&local_b8);
      if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_b8.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_b8.m_ptr = (UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)0x0;
          (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_b8.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_b8.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_a0[0] != (Allocation *)0x0) {
        (*local_a0[0]->_vptr_Allocation[1])();
        local_a0[0] = (Allocation *)0x0;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != (this->m_chunksPerAllocation).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  pMVar10 = (this->m_memoryBinds).
            super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pMVar10 ==
      (this->m_memoryBinds).
      super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar5 = (local_a8->
             super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
             ).m_data.ptr;
  }
  else {
    pSVar5 = (local_a8->
             super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
             ).m_data.ptr;
    do {
      lVar3 = **(long **)((long)(pSVar5->allocations).
                                super__Vector_base<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>,_std::allocator<de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                         (ulong)pMVar10->allocationNdx * 0x10);
      local_90.resourceOffset = pMVar10->resourceChunkNdx * uVar11;
      local_90.size = pMVar10->numChunks * uVar11;
      local_90.memory.m_internal = *(deUint64 *)(lVar3 + 8);
      local_90.memoryOffset = pMVar10->memoryChunkNdx * uVar11 + *(long *)(lVar3 + 0x10);
      local_90.flags = 0;
      __position._M_current =
           (pSVar5->memoryBinds).
           super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pSVar5->memoryBinds).
          super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
        _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                  ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>> *)
                   &pSVar5->memoryBinds,__position,&local_90);
      }
      else {
        *(ulong *)&(__position._M_current)->flags = (ulong)(uint)local_90._36_4_ << 0x20;
        ((__position._M_current)->memory).m_internal = local_90.memory.m_internal;
        (__position._M_current)->memoryOffset = local_90.memoryOffset;
        (__position._M_current)->resourceOffset = local_90.resourceOffset;
        (__position._M_current)->size = local_90.size;
        ppVVar2 = &(pSVar5->memoryBinds).
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar2 = *ppVVar2 + 1;
      }
      uVar7 = (long)(_func_int ***)local_90.size + local_90.resourceOffset;
      if (uVar7 < referenceCreateInfo.size) {
        uVar7 = referenceCreateInfo.size;
      }
      pMVar10 = pMVar10 + 1;
      referenceCreateInfo.size = uVar7;
    } while (pMVar10 !=
             (this->m_memoryBinds).
             super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pSVar5->resourceSize = referenceCreateInfo.size;
  pMVar8 = (MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
            *)(ulong)this->m_resourceChunkNdx;
  pSVar5->numResourceChunks = this->m_resourceChunkNdx;
  if (local_68.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_60,local_68);
    pMVar8 = extraout_RAX;
  }
  return pMVar8;
}

Assistant:

MovePtr<SparseAllocation> SparseAllocationBuilder::build (const DeviceInterface&	vk,
														  const VkDevice			device,
														  Allocator&				allocator,
														  VkBufferCreateInfo		referenceCreateInfo,
														  const VkDeviceSize		minChunkSize) const
{

	MovePtr<SparseAllocation>	sparseAllocation			(new SparseAllocation());

								referenceCreateInfo.size	= sizeof(deUint32);
	const Unique<VkBuffer>		refBuffer					(createBuffer(vk, device, &referenceCreateInfo));
	const VkMemoryRequirements	memoryRequirements			= getBufferMemoryRequirements(vk, device, *refBuffer);
	const VkDeviceSize			chunkSize					= std::max(memoryRequirements.alignment, static_cast<VkDeviceSize>(deAlign64(minChunkSize, memoryRequirements.alignment)));

	for (std::vector<deUint32>::const_iterator numChunksIter = m_chunksPerAllocation.begin(); numChunksIter != m_chunksPerAllocation.end(); ++numChunksIter)
	{
		sparseAllocation->allocations.push_back(makeDeSharedPtr(
			allocator.allocate(requirementsWithSize(memoryRequirements, *numChunksIter * chunkSize), MemoryRequirement::Any)));
	}

	for (std::vector<MemoryBind>::const_iterator memBindIter = m_memoryBinds.begin(); memBindIter != m_memoryBinds.end(); ++memBindIter)
	{
		const Allocation&			alloc	= **sparseAllocation->allocations[memBindIter->allocationNdx];
		const VkSparseMemoryBind	bind	=
		{
			memBindIter->resourceChunkNdx * chunkSize,							// VkDeviceSize               resourceOffset;
			memBindIter->numChunks * chunkSize,									// VkDeviceSize               size;
			alloc.getMemory(),													// VkDeviceMemory             memory;
			alloc.getOffset() + memBindIter->memoryChunkNdx * chunkSize,		// VkDeviceSize               memoryOffset;
			(VkSparseMemoryBindFlags)0,											// VkSparseMemoryBindFlags    flags;
		};
		sparseAllocation->memoryBinds.push_back(bind);
		referenceCreateInfo.size = std::max(referenceCreateInfo.size, bind.resourceOffset + bind.size);
	}

	sparseAllocation->resourceSize		= referenceCreateInfo.size;
	sparseAllocation->numResourceChunks = m_resourceChunkNdx;

	return sparseAllocation;
}